

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  lha *lha;
  uint16_t uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uchar *p;
  char *pcVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  ushort *pp;
  short *pp_00;
  byte *pbVar10;
  time_t tVar11;
  ulong uVar12;
  size_t n;
  int *piVar13;
  size_t sVar14;
  mode_t mVar15;
  ulong uVar16;
  long lVar17;
  ushort uVar18;
  int iVar19;
  void *pvVar20;
  uint uVar21;
  byte bVar22;
  void *h;
  bool bVar23;
  size_t extdsize;
  uint16_t header_crc;
  archive_string local_78;
  archive_string local_58;
  archive_string *local_40;
  void *local_38;
  
  if (lha_crc16_init_crc16init == '\0') {
    lha_crc16_init_crc16init = '\x01';
    uVar16 = 0;
    do {
      iVar19 = -8;
      uVar12 = uVar16 & 0xffffffff;
      do {
        uVar21 = 0;
        if ((uVar12 & 1) != 0) {
          uVar21 = 0xa001;
        }
        uVar21 = uVar21 ^ (uint)(uVar12 >> 1) & 0x7fff;
        uVar12 = (ulong)uVar21;
        iVar19 = iVar19 + 1;
      } while (iVar19 != 0);
      crc16tbl[0][uVar16] = (uint16_t)uVar21;
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x100);
    lVar17 = -0x200;
    do {
      uVar18 = *(ushort *)((long)crc16tbl[1] + lVar17);
      *(ushort *)((long)&archive_read_format_tar_read_header::default_inode + lVar17) =
           uVar18 >> 8 ^ crc16tbl[0][(byte)uVar18];
      lVar17 = lVar17 + 2;
    } while (lVar17 != 0);
  }
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha = (lha *)a->format->data;
  lha->decompress_init = '\0';
  lha->end_of_entry = '\0';
  lha->end_of_entry_cleanup = '\0';
  lha->entry_unconsumed = 0;
  pcVar6 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar6 == (char *)0x0) {
      return L'\x01';
    }
    if (*pcVar6 == '\0') {
      return L'\x01';
    }
LAB_0040053a:
    pcVar6 = "Truncated LHa header";
  }
  else {
    if (((lha->found_first_header == '\0') && (*pcVar6 == 'M')) && (pcVar6[1] == 'Z')) {
      uVar16 = 0x1000;
      do {
        while (pvVar7 = __archive_read_ahead(a,uVar16,(ssize_t *)&local_78), pvVar7 != (void *)0x0)
        {
          if ((long)local_78.s < 0x16) goto LAB_004004f5;
          pvVar20 = pvVar7;
          if (local_78.s != (char *)0x16) {
            pcVar6 = local_78.s + (long)pvVar7;
            h = pvVar7;
            do {
              sVar8 = lha_check_header_format(h);
              if (sVar8 == 0) {
                __archive_read_consume(a,(long)h - (long)pvVar7);
                bVar23 = false;
                wVar4 = L'\0';
                goto LAB_00400555;
              }
              pvVar20 = (void *)((long)h + sVar8);
              pcVar9 = (char *)((long)h + sVar8 + 0x16);
              h = pvVar20;
            } while (pcVar9 < pcVar6);
          }
          __archive_read_consume(a,(long)pvVar20 - (long)pvVar7);
        }
        bVar23 = 0x31 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar23);
LAB_004004f5:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out LHa header");
      wVar4 = L'\xffffffe2';
      bVar23 = true;
LAB_00400555:
      if (bVar23) {
        return wVar4;
      }
      pcVar6 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
      if (pcVar6 == (char *)0x0) goto LAB_0040053a;
    }
    if (*pcVar6 == '\0') {
      return L'\x01';
    }
    sVar8 = lha_check_header_format(pcVar6);
    if (sVar8 == 0) {
      lha->found_first_header = '\x01';
      lha->header_size = 0;
      lha->level = pcVar6[0x14];
      lha->method[0] = pcVar6[3];
      lha->method[1] = pcVar6[4];
      cVar1 = pcVar6[5];
      lha->method[2] = cVar1;
      uVar18 = *(ushort *)lha->method ^ 0x686c;
      lha->directory = cVar1 == 'd' && uVar18 == 0;
      if (cVar1 == '0' && uVar18 == 0) {
        bVar23 = false;
      }
      else {
        bVar23 = lha->method[2] != '4' || *(short *)lha->method != 0x7a6c;
      }
      lha->entry_is_compressed = bVar23;
      lha->compsize = 0;
      lha->origsize = 0;
      lha->setflag = 0;
      lha->birthtime = 0;
      lha->birthtime_tv_nsec = 0;
      lha->mtime = 0;
      lha->mtime_tv_nsec = 0;
      lha->atime = 0;
      lha->atime_tv_nsec = 0;
      mVar15 = 0x1ff;
      if (lha->directory == '\0') {
        mVar15 = 0x1b6;
      }
      lha->mode = mVar15;
      (lha->dirname).length = 0;
      local_40 = &lha->filename;
      (lha->filename).length = 0;
      lha->dos_attr = '\0';
      lha->uid = 0;
      lha->gid = 0;
      lha->sconv = lha->opt_sconv;
      switch(pcVar6[0x14]) {
      case '\0':
        pbVar10 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
        if (pbVar10 == (byte *)0x0) {
LAB_00400997:
          pcVar9 = "Truncated LHa header";
          goto LAB_0040099e;
        }
        lha->header_size = (ulong)*pbVar10 + 2;
        bVar2 = pbVar10[1];
        lha->compsize = (ulong)*(uint *)(pbVar10 + 7);
        lha->origsize = (ulong)*(uint *)(pbVar10 + 0xb);
        tVar11 = lha_dos_time(pbVar10 + 0xf);
        lha->mtime = tVar11;
        bVar22 = pbVar10[0x15];
        uVar16 = (ulong)bVar22;
        iVar19 = ((int)lha->header_size - (uint)bVar22) + -0x18;
        if (iVar19 != -2 && (iVar19 < 0 || 0xdd < bVar22)) {
          pcVar9 = "Invalid LHa header";
          goto LAB_0040099e;
        }
        pvVar7 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
        if (pvVar7 == (void *)0x0) {
LAB_00400ea2:
          pcVar9 = "Truncated LHa header";
          goto LAB_00400f99;
        }
        (lha->filename).length = 0;
        local_38 = (void *)((long)pvVar7 + 0x16);
        archive_strncat(local_40,local_38,uVar16);
        if (-1 < iVar19) {
          lha->crc = *(uint16_t *)((long)local_38 + uVar16);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        }
        sVar8 = lha->header_size;
        if (sVar8 == 2) {
          bVar22 = 0;
        }
        else {
          sVar14 = 2;
          bVar22 = 0;
          do {
            bVar22 = bVar22 + *(char *)((long)pvVar7 + sVar14);
            sVar14 = sVar14 + 1;
          } while (sVar8 != sVar14);
        }
        if (((0 < iVar19) && (*(char *)((long)pvVar7 + uVar16 + 0x18) == 'U')) && (iVar19 == 0xc)) {
          lha->mtime = (ulong)*(uint *)((long)pvVar7 + uVar16 + 0x1a);
          lha->mode = (uint)*(ushort *)((long)pvVar7 + uVar16 + 0x1e);
          lha->uid = (ulong)*(ushort *)((long)pvVar7 + uVar16 + 0x20);
          lha->gid = (ulong)*(ushort *)((long)pvVar7 + uVar16 + 0x22);
          *(byte *)&lha->setflag = (byte)lha->setflag | 4;
        }
        __archive_read_consume(a,sVar8);
        wVar4 = L'\0';
        if (bVar22 == bVar2) goto LAB_004009ca;
        pcVar9 = "LHa header sum error";
        iVar19 = -1;
        break;
      case '\x01':
        pbVar10 = (byte *)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
        if (pbVar10 == (byte *)0x0) goto LAB_00400997;
        lha->header_size = (ulong)*pbVar10 + 2;
        bVar2 = pbVar10[1];
        lha->compsize = (ulong)*(uint *)(pbVar10 + 7);
        lha->origsize = (ulong)*(uint *)(pbVar10 + 0xb);
        tVar11 = lha_dos_time(pbVar10 + 0xf);
        lha->mtime = tVar11;
        bVar22 = pbVar10[0x15];
        uVar16 = (ulong)bVar22;
        if ((bVar22 < 0xe7) && ((int)(uint)bVar22 <= (int)lha->header_size + -0x1b)) {
          pvVar7 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
          if (pvVar7 == (void *)0x0) goto LAB_00400ea2;
          pvVar20 = (void *)((long)pvVar7 + 0x16);
          if (uVar16 != 0) {
            uVar12 = 0;
            do {
              if (*(char *)((long)pvVar20 + uVar12) == -1) goto LAB_00400f92;
              uVar12 = uVar12 + 1;
            } while (uVar16 != uVar12);
          }
          (lha->filename).length = 0;
          archive_strncat(local_40,pvVar20,uVar16);
          lha->crc = *(uint16_t *)((long)pvVar20 + uVar16);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          lVar17 = lha->header_size - 2;
          if (lVar17 == 0) {
            bVar22 = 0;
          }
          else {
            sVar8 = 2;
            bVar22 = 0;
            do {
              bVar22 = bVar22 + *(char *)((long)pvVar7 + sVar8);
              sVar8 = sVar8 + 1;
            } while (lha->header_size != sVar8);
          }
          __archive_read_consume(a,lVar17);
          wVar4 = lha_read_file_extended_header
                            (a,lha,(uint16_t *)0x0,L'\x02',lha->compsize + 2,(size_t *)&local_78);
          if (L'\xffffffeb' < wVar4) {
            lVar17 = (lha->compsize - (long)local_78.s) + 2;
            lha->compsize = lVar17;
            if (lVar17 < 0) goto LAB_00400f92;
            if (bVar22 != bVar2) {
              pcVar9 = "LHa header sum error";
              iVar19 = -1;
              goto LAB_00400fa1;
            }
            wVar4 = wVar4 & wVar4 >> 0x1f;
          }
        }
        else {
LAB_00400f92:
          pcVar9 = "Invalid LHa header";
LAB_00400f99:
          iVar19 = 0x54;
LAB_00400fa1:
          archive_set_error(&a->archive,iVar19,pcVar9);
          wVar4 = L'\xffffffe2';
        }
        goto LAB_004009ca;
      case '\x02':
        pp = (ushort *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
        pcVar9 = "Truncated LHa header";
        if (pp != (ushort *)0x0) {
          uVar18 = *pp;
          lha->header_size = (ulong)uVar18;
          lha->compsize = (ulong)*(uint *)((long)pp + 7);
          lha->origsize = (ulong)*(uint *)((long)pp + 0xb);
          lha->mtime = (ulong)*(uint *)((long)pp + 0xf);
          lha->crc = *(uint16_t *)((long)pp + 0x15);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          if ((ulong)uVar18 < 0x18) {
            pcVar9 = "Invalid LHa header size";
          }
          else {
            uVar3 = lha_crc16(0,pp,0x18);
            local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar3);
            __archive_read_consume(a,0x18);
            wVar4 = lha_read_file_extended_header
                              (a,lha,(uint16_t *)&local_58,L'\x02',lha->header_size - 0x18,
                               (size_t *)&local_78);
            if (wVar4 < L'\xffffffec') goto LAB_004009ca;
            uVar21 = ((int)lha->header_size - (int)local_78.s) - 0x18;
            if (0 < (int)uVar21) {
              uVar16 = (ulong)uVar21;
              pvVar7 = __archive_read_ahead(a,uVar16,(ssize_t *)0x0);
              if (pvVar7 == (void *)0x0) goto LAB_004007aa;
              uVar3 = lha_crc16((uint16_t)local_58.s,pvVar7,uVar16);
              local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar3);
              __archive_read_consume(a,uVar16);
            }
            if ((uint16_t)local_58.s == lha->header_crc) goto LAB_004009ca;
            pcVar9 = "LHa header CRC error";
          }
        }
LAB_004007aa:
        archive_set_error(&a->archive,0x54,pcVar9);
        wVar4 = L'\xffffffe2';
        goto LAB_004009ca;
      case '\x03':
        pp_00 = (short *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
        if (pp_00 == (short *)0x0) goto LAB_00400997;
        pcVar9 = "Invalid LHa header";
        if (*pp_00 == 4) {
          uVar21 = *(uint *)(pp_00 + 0xc);
          lha->header_size = (ulong)uVar21;
          lha->compsize = (ulong)*(uint *)((long)pp_00 + 7);
          lha->origsize = (ulong)*(uint *)((long)pp_00 + 0xb);
          lha->mtime = (ulong)*(uint *)((long)pp_00 + 0xf);
          lha->crc = *(uint16_t *)((long)pp_00 + 0x15);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          if (0x1f < (ulong)uVar21) {
            uVar3 = lha_crc16(0,pp_00,0x1c);
            local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar3);
            __archive_read_consume(a,0x1c);
            wVar4 = lha_read_file_extended_header
                              (a,lha,(uint16_t *)&local_58,L'\x04',lha->header_size - 0x1c,
                               (size_t *)&local_78);
            if ((wVar4 < L'\xffffffec') || ((uint16_t)local_58.s == lha->header_crc))
            goto LAB_004009ca;
            pcVar9 = "LHa header CRC error";
          }
        }
LAB_0040099e:
        iVar19 = 0x54;
        break;
      default:
        archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d");
        goto LAB_004009c5;
      }
      archive_set_error(&a->archive,iVar19,pcVar9);
LAB_004009c5:
      wVar4 = L'\xffffffe2';
LAB_004009ca:
      if (wVar4 < L'\xffffffec') {
        return wVar4;
      }
      if ((lha->directory == '\0') && ((lha->filename).length == 0)) goto LAB_0040053a;
      archive_string_concat(&lha->dirname,local_40);
      local_58.s = (char *)0x0;
      local_58.buffer_length = 0;
      local_78.s = (char *)0x0;
      local_78.length = 0;
      local_78.buffer_length = 0;
      local_58.length = 0;
      archive_string_concat(&local_58,&lha->dirname);
      if ((lha->mode & 0xf000) == 0xa000) {
        pcVar9 = strchr(local_58.s,0x7c);
        if (pcVar9 == (char *)0x0) {
          archive_set_error(&a->archive,0x54,"Unknown symlink-name");
          archive_string_free(&local_58);
          archive_string_free(&local_78);
          return L'\xffffffe7';
        }
        n = strlen(pcVar9 + 1);
        local_78.length = 0;
        archive_strncat(&local_78,pcVar9 + 1,n);
        *pcVar9 = '\0';
        local_58.length = strlen(local_58.s);
      }
      else {
        lha->mode = (lha->mode & 0xffff0fff) + (uint)(lha->directory == '\0') * 0x4000 + 0x4000;
      }
      if (((lha->setflag & 4) == 0) && ((lha->dos_attr & 1) != 0)) {
        *(byte *)&lha->mode = (byte)lha->mode & 0x6d;
      }
      wVar5 = _archive_entry_copy_pathname_l(entry,local_58.s,local_58.length,lha->sconv);
      if (wVar5 != L'\0') {
        piVar13 = __errno_location();
        if (*piVar13 != 0xc) {
          pcVar9 = archive_string_conversion_charset_name(lha->sconv);
          archive_set_error(&a->archive,0x54,
                            "Pathname cannot be converted from %s to current locale.",pcVar9);
          wVar4 = L'\xffffffec';
          goto LAB_00400b37;
        }
        pcVar6 = "Can\'t allocate memory for Pathname";
LAB_00400b7c:
        iVar19 = 0xc;
        goto LAB_0040059c;
      }
LAB_00400b37:
      archive_string_free(&local_58);
      if (local_78.length == 0) {
        archive_entry_set_symlink(entry,(char *)0x0);
      }
      else {
        wVar5 = _archive_entry_copy_symlink_l(entry,local_78.s,local_78.length,lha->sconv);
        if (wVar5 != L'\0') {
          piVar13 = __errno_location();
          if (*piVar13 == 0xc) {
            pcVar6 = "Can\'t allocate memory for Linkname";
            goto LAB_00400b7c;
          }
          pcVar9 = archive_string_conversion_charset_name(lha->sconv);
          archive_set_error(&a->archive,0x54,
                            "Linkname cannot be converted from %s to current locale.",pcVar9);
          wVar4 = L'\xffffffec';
        }
      }
      archive_string_free(&local_78);
      if (pcVar6[0x14] == '\0') {
        lha_replace_path_separator(lha,entry);
      }
      archive_entry_set_mode(entry,lha->mode);
      archive_entry_set_uid(entry,lha->uid);
      archive_entry_set_gid(entry,lha->gid);
      if ((lha->uname).length != 0) {
        archive_entry_set_uname(entry,(lha->uname).s);
      }
      if ((lha->gname).length != 0) {
        archive_entry_set_gname(entry,(lha->gname).s);
      }
      if ((lha->setflag & 1) == 0) {
        archive_entry_unset_birthtime(entry);
        archive_entry_unset_ctime(entry);
      }
      else {
        archive_entry_set_birthtime(entry,lha->birthtime,lha->birthtime_tv_nsec);
        archive_entry_set_ctime(entry,lha->birthtime,lha->birthtime_tv_nsec);
      }
      archive_entry_set_mtime(entry,lha->mtime,lha->mtime_tv_nsec);
      if ((lha->setflag & 2) == 0) {
        archive_entry_unset_atime(entry);
      }
      else {
        archive_entry_set_atime(entry,lha->atime,lha->atime_tv_nsec);
      }
      if ((lha->directory == '\0') && (pcVar6 = archive_entry_symlink(entry), pcVar6 == (char *)0x0)
         ) {
        archive_entry_set_size(entry,lha->origsize);
      }
      else {
        archive_entry_unset_size(entry);
      }
      lVar17 = lha->compsize;
      lha->entry_bytes_remaining = lVar17;
      if (-1 < lVar17) {
        lha->entry_offset = 0;
        lha->entry_crc_calculated = 0;
        if ((lVar17 == 0) || (lha->directory != '\0')) {
          lha->end_of_entry = '\x01';
        }
        sprintf(lha->format_name,"lha -%c%c%c-",(ulong)(uint)(int)lha->method[0],
                (ulong)(uint)(int)lha->method[1],(ulong)(uint)(int)lha->method[2]);
        (a->archive).archive_format_name = lha->format_name;
        return wVar4;
      }
      pcVar6 = "Invalid LHa entry size";
    }
    else {
      pcVar6 = "Bad LHa file";
    }
  }
  iVar19 = 0x54;
LAB_0040059c:
  archive_set_error(&a->archive,iVar19,pcVar6);
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_string linkname;
	struct archive_string pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	
	lha_crc16_init();

	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL)
		lha->sconv = lha->opt_sconv;
	else
		lha->sconv = NULL;

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename.
	 */
	archive_string_concat(&lha->dirname, &lha->filename);
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_copy(&pathname, &lha->dirname);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_string_free(&pathname);
			archive_string_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	if (archive_entry_copy_pathname_l(entry, pathname.s,
	    pathname.length, lha->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(lha->sconv));
		err = ARCHIVE_WARN;
	}
	archive_string_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		if (archive_entry_copy_symlink_l(entry, linkname.s,
		    linkname.length, lha->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(lha->sconv));
			err = ARCHIVE_WARN;
		}
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_string_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	if (lha->entry_bytes_remaining < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa entry size");
		return (ARCHIVE_FATAL);
	}
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	sprintf(lha->format_name, "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}